

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeCommandListCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_list_desc_t *desc,
          ze_command_list_handle_t *phCommandList)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_61;
  ze_context_handle_t local_60;
  code *local_58;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  local_60 = hContext;
  std::__cxx11::string::string
            ((string *)&local_50,"zeCommandListCreate(hContext, hDevice, desc, phCommandList)",
             &local_61);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar4 + 0x218) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar3 = 0;
    local_58 = *(code **)(lVar4 + 0x218);
    do {
      if (lVar5 == lVar3) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeCommandListCreatePrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),local_60,hDevice,
                                desc,phCommandList), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(local_60,hDevice,desc,phCommandList);
          lVar4 = 0;
          goto LAB_0014a925;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar3 * 8);
      result = (**(code **)(*plVar1 + 0x230))(plVar1,local_60,hDevice,desc,phCommandList);
      lVar3 = lVar3 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014a962;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar4 * 8);
    result = (**(code **)(*plVar1 + 0x238))(plVar1,local_60,hDevice,desc,phCommandList,zVar2);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014a925:
    lVar3 = context;
    if (lVar5 == lVar4) {
      result = zVar2;
      if (((zVar2 == ZE_RESULT_SUCCESS) && (phCommandList != (ze_command_list_handle_t *)0x0)) &&
         (*(char *)(context + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*phCommandList,true);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar3 + 0xd48),local_60,*phCommandList);
      }
      break;
    }
  }
LAB_0014a962:
  logAndPropagateResult("zeCommandListCreate",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_list_desc_t* desc,             ///< [in] pointer to command list descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        context.logger->log_trace("zeCommandListCreate(hContext, hDevice, desc, phCommandList)");

        auto pfnCreate = context.zeDdiTable.CommandList.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeCommandListCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreatePrologue( hContext, hDevice, desc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListCreatePrologue( hContext, hDevice, desc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }

        auto driver_result = pfnCreate( hContext, hDevice, desc, phCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateEpilogue( hContext, hDevice, desc, phCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phCommandList){
                context.handleLifetime->addHandle( *phCommandList );
                context.handleLifetime->addDependent( hContext, *phCommandList );

            }
        }
        return logAndPropagateResult("zeCommandListCreate", driver_result);
    }